

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::addLargeChunk
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,MemChunk *chunk)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  PtrAVLTree *this_00;
  PtrAVLTree *tree;
  uint K;
  uint X;
  BinIndexType treeBinIndex;
  MemChunk *chunk_local;
  MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  sVar5 = MemChunk::getChunkSize(chunk);
  uVar3 = (uint)(sVar5 >> 8);
  if (uVar3 == 0) {
    K = 0;
  }
  else if (uVar3 < 0x10000) {
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar4 = 0x1f - (uVar1 ^ 0x1f);
    sVar5 = MemChunk::getChunkSize(chunk);
    K = iVar4 * 2 + ((uint)(sVar5 >> ((char)iVar4 + 7U & 0x3f)) & 1);
  }
  else {
    K = 0x1f;
  }
  this_00 = treeAt(this,K);
  bVar2 = isTreeMapMarked(this,K);
  if (!bVar2) {
    markTreeMap(this,K);
  }
  sVar5 = MemChunk::getChunkSize(chunk);
  PtrAVLTree::add(this_00,chunk,sVar5);
  return;
}

Assistant:

void
    addLargeChunk (MemChunk* chunk)
    {
        BinIndexType treeBinIndex;
        cookmem_getLargeBinIndex(chunk->getChunkSize(), treeBinIndex);
        PtrAVLTree& tree = treeAt(treeBinIndex);
        if (!isTreeMapMarked(treeBinIndex))
        {
            markTreeMap(treeBinIndex);
        }
        tree.add(chunk, chunk->getChunkSize());
    }